

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

string * __thiscall helics::InputInfo::getTargets_abi_cxx11_(InputInfo *this)

{
  string *this_00;
  pointer psVar1;
  pointer psVar2;
  string_t local_60;
  data local_40;
  
  this_00 = &this->sourceTargets;
  if ((this->sourceTargets)._M_string_length == 0) {
    psVar2 = (this->source_info).
             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->source_info).
             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar2 != psVar1) {
      if ((long)psVar1 - (long)psVar2 == 0x60) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,'[');
        psVar2 = (this->source_info).
                 super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (this->source_info).
                 super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar2 != psVar1) {
          do {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_40,&psVar2->key);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump(&local_60,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_40);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      local_60._M_dataplus._M_p,local_60._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      ',');
            psVar2 = psVar2 + 1;
          } while (psVar2 != psVar1);
        }
        (this->sourceTargets)._M_dataplus._M_p[(this->sourceTargets)._M_string_length - 1] = ']';
      }
    }
  }
  return this_00;
}

Assistant:

const std::string& InputInfo::getTargets() const
{
    if (sourceTargets.empty()) {
        if (!source_info.empty()) {
            if (source_info.size() == 1) {
                sourceTargets = source_info.front().key;
            } else {
                sourceTargets.push_back('[');
                for (const auto& src : source_info) {
                    sourceTargets.append(generateJsonQuotedString(src.key));
                    sourceTargets.push_back(',');
                }
                sourceTargets.back() = ']';
            }
        }
    }
    return sourceTargets;
}